

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::to_semantic_abi_cxx11_
          (CompilerHLSL *this,uint32_t location,ExecutionModel em,StorageClass sc)

{
  VectorView<spirv_cross::HLSLVertexAttributeRemap> *this_00;
  HLSLVertexAttributeRemap *pHVar1;
  undefined4 in_register_00000034;
  int in_R8D;
  HLSLVertexAttributeRemap *attribute;
  HLSLVertexAttributeRemap *__end2;
  HLSLVertexAttributeRemap *__begin2;
  SmallVector<spirv_cross::HLSLVertexAttributeRemap,_8UL> *__range2;
  StorageClass sc_local;
  ExecutionModel em_local;
  uint32_t location_local;
  CompilerHLSL *this_local;
  
  _em_local = CONCAT44(in_register_00000034,location);
  sc_local = em;
  this_local = this;
  if ((sc == StorageClassUniformConstant) && (in_R8D == 1)) {
    this_00 = (VectorView<spirv_cross::HLSLVertexAttributeRemap> *)(_em_local + 0x24a8);
    __end2 = VectorView<spirv_cross::HLSLVertexAttributeRemap>::begin(this_00);
    pHVar1 = VectorView<spirv_cross::HLSLVertexAttributeRemap>::end(this_00);
    for (; __end2 != pHVar1; __end2 = __end2 + 1) {
      if (__end2->location == sc_local) {
        ::std::__cxx11::string::string((string *)this,(string *)&__end2->semantic);
        return this;
      }
    }
  }
  join<char_const(&)[9],unsigned_int&>((spirv_cross *)this,(char (*) [9])"TEXCOORD",&sc_local);
  return this;
}

Assistant:

std::string CompilerHLSL::to_semantic(uint32_t location, ExecutionModel em, StorageClass sc)
{
	if (em == ExecutionModelVertex && sc == StorageClassInput)
	{
		// We have a vertex attribute - we should look at remapping it if the user provided
		// vertex attribute hints.
		for (auto &attribute : remap_vertex_attributes)
			if (attribute.location == location)
				return attribute.semantic;
	}

	// Not a vertex attribute, or no remap_vertex_attributes entry.
	return join("TEXCOORD", location);
}